

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onInst
          (RACFGBuilder *this,InstNode *inst,InstControlFlow *cf,RAInstBuilder *ib)

{
  uint *puVar1;
  FuncValue *arg;
  undefined8 *puVar2;
  InstNode IVar3;
  RegMask useRegMask;
  RAInstBuilder *pRVar4;
  _func_int **pp_Var5;
  long lVar6;
  BaseRAPass *pBVar7;
  long lVar8;
  _func_int *p_Var9;
  byte bVar10;
  byte bVar11;
  Error EVar12;
  uint uVar13;
  int iVar14;
  RATiedReg *tiedReg;
  RAStackSlot *pRVar15;
  ulong uVar16;
  RAInstBuilder *pRVar17;
  RAInstBuilder *pRVar18;
  long lVar19;
  long extraout_RAX;
  undefined8 extraout_RAX_00;
  char cVar20;
  RATiedFlags RVar21;
  undefined1 *puVar22;
  ulong uVar23;
  Operand_ *pOVar24;
  undefined4 uVar25;
  uint extraout_EDX;
  long lVar26;
  uint uVar27;
  Environment EVar28;
  InstId IVar29;
  Environment EVar30;
  InvokeNode *invokeNode;
  uint uVar31;
  BaseBuilder *pBVar33;
  uint32_t uVar34;
  uint32_t uVar35;
  uint32_t uVar36;
  uint32_t uVar37;
  RATiedFlags RVar38;
  long lVar39;
  int iVar40;
  ulong uVar41;
  long lVar42;
  RAInstBuilder *__range4;
  bool bVar43;
  undefined1 auVar44 [16];
  Operand_ OStackY_230;
  InvokeNode *pIStackY_218;
  Operand_ OStackY_210;
  RAWorkReg *pRStackY_1f8;
  undefined1 *puStackY_1f0;
  uint local_1b4;
  RAWorkReg *workReg;
  BaseRAPass *local_1a8;
  InstNode *local_1a0;
  uint local_194;
  ulong local_190;
  int local_184;
  ulong local_180;
  RAInstBuilder *local_178;
  Environment local_170;
  ulong local_168;
  BaseRAPass *local_160;
  Environment local_158;
  Environment local_150;
  ulong local_148;
  ulong local_140;
  Operand_ *local_138;
  InstRWInfo rwInfo;
  BaseRAPass *pBVar32;
  
  local_158._platformABI = kUnknown;
  local_158._objectFormat = kUnknown;
  local_158._floatABI = kHardFloat;
  local_158._reserved = '\0';
  local_158._0_4_ = *(uint *)(inst + 0x30);
  if (0x6ba < (ulong)local_158) {
    return 0;
  }
  EVar28 = (Environment)(inst + 0x30);
  IVar3 = inst[0x12];
  uVar16 = (ulong)(byte)IVar3;
  pOVar24 = (Operand_ *)(inst + 0x40);
  EVar30 = EVar28;
  local_160 = (BaseRAPass *)cf;
  EVar12 = InstInternal::queryRWInfo((Arch)this[0x290],(BaseInst *)EVar28,pOVar24,uVar16,&rwInfo);
  if (EVar12 != 0) {
    return EVar12;
  }
  *(InstRWFlags *)(ib + 4) = *(InstRWFlags *)(ib + 4) | rwInfo._instFlags & ~kMovOp;
  local_1a8 = (BaseRAPass *)this;
  local_1a0 = inst;
  local_150 = EVar28;
  if (IVar3 == (InstNode)0x0) {
    bVar11 = 0;
    local_190 = 0;
    uVar41 = 0;
  }
  else {
    puVar22 = InstDB::_commonInfoTable;
    uVar27 = *(uint *)(InstDB::_commonInfoTable +
                      (*(uint *)(InstDB::_instInfoTable + (long)local_158 * 8) >> 0xb & 0x1ff8));
    if ((uVar27 >> 0x17 & 1) == 0) {
      local_1b4 = 0xffff;
      if ((uVar27 >> 0x1c & 1) != 0) {
        ib[0xb] = (RAInstBuilder)((byte)ib[0xb] | 0x80);
        local_1b4 = 0xffffffff;
      }
    }
    else {
      puVar22 = (undefined1 *)(ulong)(uVar27 & 0x2400000);
      local_1b4 = 0xffffffff;
      if ((uVar27 & 0x2400000) == 0x400000) {
        if ((uVar27 >> 0x1a & 1) == 0) {
          local_1b4 = 0xffff;
          if ((uVar27 >> 0x1b & 1) != 0) {
            local_1b4 = -(uint)(IVar3 == (InstNode)0x2) | 0xffff;
          }
        }
        else {
          local_1b4 = -(uint)(((pOVar24->_signature)._bits & 0xff000fff) == 0x289) | 0xffff;
          puVar22 = (undefined1 *)(ulong)local_1b4;
        }
      }
    }
    EVar30 = (Environment)((ulong)(byte)IVar3 << 4);
    local_184 = -1;
    lVar19 = 0;
    uVar41 = 0;
    local_168 = 0;
    local_190 = 0;
    uVar27 = 0;
    local_194 = 0;
    local_148 = 0xffffffff;
    local_178 = ib;
    local_170 = EVar30;
    local_140 = uVar16;
    local_138 = pOVar24;
    do {
      if (lVar19 == 0x60) {
        onInst();
        local_160 = (BaseRAPass *)this;
        uVar27 = EVar30._0_4_;
        lVar19 = extraout_RAX;
        uVar13 = extraout_EDX;
        goto LAB_001471ec;
      }
      uVar13 = *(uint *)(inst + 0x40 + lVar19);
      EVar28._0_4_ = uVar13 & 7;
      EVar28._platformABI = kUnknown;
      EVar28._objectFormat = kUnknown;
      EVar28._floatABI = kHardFloat;
      EVar28._reserved = '\0';
      if (EVar28._0_4_ == 2) {
        local_178[0xc] = (RAInstBuilder)((byte)local_178[0xc] | 0x30);
        if ((uVar13 >> 0xd & 1) == 0) {
          if (((uVar13 & 0xf8) < 9) ||
             (uVar13 = *(int *)(inst + 0x44 + lVar19) - 0x100, 0xfffffefe < uVar13))
          goto LAB_00146a58;
          pBVar32 = (BaseRAPass *)(((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass;
          pBVar33 = (pBVar32->super_FuncPass).super_Pass._cb;
          if (*(uint *)&pBVar33[1].super_BaseEmitter._logger <= uVar13) {
            return 0x1e;
          }
          EVar30 = (&(pBVar33[1].super_BaseEmitter._code)->_environment)[uVar13];
          workReg = *(RAWorkReg **)((long)EVar30 + 0x28);
          if ((workReg == (RAWorkReg *)0x0) &&
             (EVar12 = BaseRAPass::_asWorkReg(pBVar32,(VirtReg *)EVar30,&workReg), inst = local_1a0,
             this = (RACFGBuilder *)local_1a8, EVar12 != 0)) {
            return EVar12;
          }
          if (((byte)workReg[0x21] & 0xf) < 4) {
            uVar31 = *(uint *)(rwInfo._operands[0]._reserved + lVar19 * 2 + -7) >> 0xc & 3;
            ib = (RAInstBuilder *)(ulong)uVar31;
            RVar38 = *(RATiedFlags *)
                      (raUseOutFlagsFromRWFlags(asmjit::v1_14::OpRWFlags)::map + (long)ib * 4);
            local_180 = (ulong)*(uint *)((long)(((BaseRAPass *)this)->super_FuncPass).super_Pass.
                                               _vptr_Pass +
                                        (ulong)((byte)workReg[0x21] & 0xf) * 4 + 0x118);
            uVar35 = InstNode::getRewriteIndex(inst,(uint32_t *)(inst + lVar19 + 0x44));
            uVar35 = 1 << ((byte)uVar35 & 0x1f);
            uVar13 = *(uint *)(rwInfo._operands[0]._reserved + lVar19 * 2 + -7);
            if ((5U >> uVar31 & 1) == 0) {
              uVar37 = 0xff;
              uVar36 = uVar35;
              uVar35 = 0;
              if ((uVar13 >> 9 & 1) == 0) {
                uVar34 = 0xff;
              }
              else {
                uVar34 = (uint32_t)rwInfo._operands[0]._reserved[lVar19 * 2 + -3];
                RVar38 = RVar38 | kUseFixed;
              }
            }
            else {
              uVar34 = 0xff;
              if ((uVar13 >> 9 & 1) == 0) {
                uVar36 = 0;
                uVar37 = 0xff;
              }
              else {
                uVar37 = (uint32_t)rwInfo._operands[0]._reserved[lVar19 * 2 + -3];
                RVar38 = RVar38 | kOutFixed;
                uVar36 = 0;
              }
            }
            puStackY_1f0 = (undefined1 *)0x146e67;
            EVar12 = RAInstBuilder::add(local_178,workReg,RVar38,(RegMask)local_180,uVar34,uVar36,
                                        (RegMask)local_180,uVar37,uVar35,0,0xffffffff);
            EVar30 = local_170;
            inst = local_1a0;
            this = (RACFGBuilder *)local_1a8;
            if (EVar12 != 0) {
              return EVar12;
            }
            goto LAB_00146a58;
          }
LAB_00147375:
          onInst();
LAB_0014737a:
          onInst();
LAB_0014737f:
          onInst();
          goto LAB_00147384;
        }
        pBVar32 = (BaseRAPass *)(((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass;
        pBVar33 = (pBVar32->super_FuncPass).super_Pass._cb;
        if (*(uint *)&pBVar33[1].super_BaseEmitter._logger <=
            *(int *)(inst + 0x44 + lVar19) - 0x100U) {
          return 0x1e;
        }
        EVar30 = (&(pBVar33[1].super_BaseEmitter._code)->_environment)
                 [*(int *)(inst + 0x44 + lVar19) - 0x100U];
        workReg = *(RAWorkReg **)((long)EVar30 + 0x28);
        if ((workReg == (RAWorkReg *)0x0) &&
           (EVar12 = BaseRAPass::_asWorkReg(pBVar32,(VirtReg *)EVar30,&workReg), inst = local_1a0,
           this = (RACFGBuilder *)local_1a8, EVar12 != 0)) {
          return EVar12;
        }
        ib = (RAInstBuilder *)workReg;
        EVar30 = local_170;
        if (*(long *)(workReg + 0x18) == 0) {
          pp_Var5 = (((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass;
          pRVar15 = RAStackAllocator::newSlot
                              ((RAStackAllocator *)(pp_Var5 + 0x3f),
                               *(uint32_t *)((long)pp_Var5 + 0x1dc),
                               *(uint32_t *)(*(long *)(workReg + 8) + 8),
                               (uint)*(byte *)(*(long *)(workReg + 8) + 0xc),1);
          *(RAStackSlot **)((RAWorkReg *)ib + 0x18) = pRVar15;
          ((RAWorkReg *)ib)[0x25] = (RAWorkReg)((byte)((RAWorkReg *)ib)[0x25] | 1);
          EVar30 = local_170;
          inst = local_1a0;
          this = (RACFGBuilder *)local_1a8;
        }
LAB_00146a58:
        puVar22 = (undefined1 *)0x1f00;
        if (0x100 < (*(uint *)(inst + 0x40 + lVar19) & 0x1f00)) {
          puVar22 = (undefined1 *)0xffffff00;
          uVar13 = *(int *)(inst + 0x48 + lVar19) - 0x100;
          if (uVar13 < 0xfffffeff) {
            pBVar32 = (BaseRAPass *)(((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass;
            pBVar33 = (pBVar32->super_FuncPass).super_Pass._cb;
            if (*(uint *)&pBVar33[1].super_BaseEmitter._logger <= uVar13) {
              return 0x1e;
            }
            EVar30 = (&(pBVar33[1].super_BaseEmitter._code)->_environment)[uVar13];
            workReg = *(RAWorkReg **)((long)EVar30 + 0x28);
            if ((workReg == (RAWorkReg *)0x0) &&
               (EVar12 = BaseRAPass::_asWorkReg(pBVar32,(VirtReg *)EVar30,&workReg),
               inst = local_1a0, this = (RACFGBuilder *)local_1a8, EVar12 != 0)) {
              return EVar12;
            }
            if (3 < ((byte)workReg[0x21] & 0xf)) goto LAB_00147366;
            uVar13 = *(uint *)((long)(((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass +
                              (ulong)((byte)workReg[0x21] & 0xf) * 4 + 0x118) & local_1b4;
            puVar22 = (undefined1 *)(ulong)uVar13;
            uVar31 = *(uint *)(rwInfo._operands[0]._reserved + lVar19 * 2 + -7) >> 0xe & 3;
            ib = (RAInstBuilder *)(ulong)uVar31;
            uVar35 = InstNode::getRewriteIndex(inst,(uint32_t *)(inst + lVar19 + 0x48));
            uVar34 = 1 << ((byte)uVar35 & 0x1f);
            uVar35 = 0;
            if ((5U >> uVar31 & 1) == 0) {
              uVar35 = uVar34;
              uVar34 = 0;
            }
            puStackY_1f0 = (undefined1 *)0x146b65;
            EVar12 = RAInstBuilder::add(local_178,workReg,kUse|kRead,uVar13,0xff,uVar35,uVar13,0xff,
                                        uVar34,0,0xffffffff);
            EVar30 = local_170;
            inst = local_1a0;
            this = (RACFGBuilder *)local_1a8;
            if (EVar12 != 0) {
              return EVar12;
            }
          }
        }
      }
      else if (EVar28._0_4_ == 1) {
        uVar31 = *(uint *)(rwInfo._operands[0]._reserved + lVar19 * 2 + -7);
        RVar38 = (uVar31 & 0x80) << 8 |
                 *(RATiedFlags *)
                  (raUseOutFlagsFromRWFlags(asmjit::v1_14::OpRWFlags)::map + (ulong)(uVar31 & 7) * 4
                  );
        if (((uVar13 & 0xff000000) == 0x1000000) && ((uVar31 & 0x100) == 0)) {
          RVar38 = RVar38 | kX86_Gpb;
          ib = (RAInstBuilder *)0xf;
          if (((BaseRAPass *)this)->field_0x291 == '\x01') {
            bVar43 = (uVar13 & 0x1000fff) == 0x1000021;
            uVar13 = local_1b4;
            if (bVar43) {
              uVar13 = 0xf;
            }
            ib = (RAInstBuilder *)(ulong)uVar13;
            local_168 = CONCAT71((int7)(local_168 >> 8),(byte)local_168 | bVar43);
          }
        }
        else {
          ib = (RAInstBuilder *)(ulong)local_1b4;
        }
        puVar22 = (undefined1 *)0xffffff00;
        uVar13 = *(int *)(inst + 0x44 + lVar19) - 0x100;
        if (uVar13 < 0xfffffeff) {
          pBVar32 = (BaseRAPass *)(((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass;
          pBVar33 = (pBVar32->super_FuncPass).super_Pass._cb;
          if (*(uint *)&pBVar33[1].super_BaseEmitter._logger <= uVar13) {
            return 0x1e;
          }
          EVar30 = (&(pBVar33[1].super_BaseEmitter._code)->_environment)[uVar13];
          workReg = *(RAWorkReg **)((long)EVar30 + 0x28);
          if ((workReg == (RAWorkReg *)0x0) &&
             (EVar12 = BaseRAPass::_asWorkReg(pBVar32,(VirtReg *)EVar30,&workReg),
             this = (RACFGBuilder *)local_1a8, EVar12 != 0)) {
            return EVar12;
          }
          if (((RVar38 & kRW) == kWrite) &&
             ((*(ulong *)(workReg + 0x40) &
              ~(*(ulong *)(rwInfo._operands[0]._reserved + lVar19 * 2 + 0x11) |
               *(ulong *)(rwInfo._operands[0]._reserved + lVar19 * 2 + 9))) != 0)) {
            RVar38 = RVar38 & ~(kOut|kUse|kRead) | (kUse|kRead);
          }
          pBVar32 = (BaseRAPass *)(ulong)local_194;
          if ((((ulong)rwInfo._rmFeature != 0) && ((RVar38 & (kOutRM|kUseRM)) != kNone)) &&
             ((*(ulong *)(&((((((BaseRAPass *)this)->super_FuncPass).super_Pass._cb)->
                            super_BaseEmitter)._code)->_cpuFeatures +
                         (ulong)(rwInfo._rmFeature >> 6) * 8) >> ((ulong)rwInfo._rmFeature & 0x3f) &
              1) == 0)) {
            RVar38 = RVar38 & ~(kOutRM|kUseRM);
          }
          EVar30 = (Environment)workReg;
          if (3 < ((byte)workReg[0x21] & 0xf)) {
            onInst();
LAB_00147361:
            onInst();
LAB_00147366:
            onInst();
LAB_0014736b:
            onInst();
LAB_00147370:
            onInst();
            goto LAB_00147375;
          }
          uVar13 = (uint)ib &
                   *(uint *)((long)(((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass +
                            (ulong)((byte)workReg[0x21] & 0xf) * 4 + 0x118);
          uVar16 = (ulong)uVar13;
          bVar11 = rwInfo._operands[0]._reserved[lVar19 * 2 + -1];
          if (bVar11 != 0) {
            if (local_184 != -1) {
              return 3;
            }
            if ((RVar38 & kConsecutiveData) != kNone) {
              return 0x3c;
            }
            if (4 < bVar11) goto LAB_00147361;
            RVar21 = (uint)bVar11 * 0x2000 - kLeadConsecutive | RVar38;
            local_184 = *(int *)workReg;
            if ((RVar38 & kUse) == kNone) {
              RVar38 = RVar21 | kOutConsecutive;
              uVar16 = (ulong)(*(uint *)(raConsecutiveLeadCountToRegMaskFilter + (ulong)bVar11 * 4)
                              & uVar13);
            }
            else {
              RVar38 = RVar21 | kUseConsecutive;
              uVar13 = *(uint *)(raConsecutiveLeadCountToRegMaskFilter + (ulong)bVar11 * 4) & uVar13
              ;
            }
          }
          uVar23 = lVar19 + 8 >> 2;
          local_180 = uVar16;
          if ((RVar38 & kUse) != kNone) {
            if (0x19 < uVar23) goto LAB_0014736b;
            uVar35 = 1 << ((byte)uVar23 & 0x1f);
            uVar31 = *(uint *)(rwInfo._operands[0]._reserved + lVar19 * 2 + -7);
            if ((uVar31 >> 8 & 1) != 0) {
              uVar36 = (uint32_t)rwInfo._operands[0]._reserved[lVar19 * 2 + -3];
              RVar38 = RVar38 | kUseFixed;
              uVar34 = 0xff;
              uVar37 = 0;
              goto LAB_00146d98;
            }
            uVar37 = 0;
            if ((uVar31 & 8) == 0) goto LAB_00146d8d;
            if (local_184 == -1) {
              return 3;
            }
            if (local_184 == *(int *)workReg) {
              return 0x41;
            }
            uVar31 = local_194 + 1;
            pBVar32 = (BaseRAPass *)(ulong)uVar31;
            if (uVar31 < 4) {
              RVar38 = uVar31 * 0x2000 | RVar38 | kUseConsecutive;
              goto LAB_00146d8a;
            }
            goto LAB_0014737a;
          }
          if (0x19 < uVar23) goto LAB_00147370;
          uVar37 = 1 << ((byte)uVar23 & 0x1f);
          uVar31 = *(uint *)(rwInfo._operands[0]._reserved + lVar19 * 2 + -7);
          if ((uVar31 >> 8 & 1) != 0) {
            uVar34 = (uint32_t)rwInfo._operands[0]._reserved[lVar19 * 2 + -3];
            RVar38 = RVar38 | kOutFixed;
            uVar36 = 0xff;
            uVar35 = 0;
LAB_00146d98:
            ib = (RAInstBuilder *)(ulong)uVar13;
            puStackY_1f0 = (undefined1 *)0x146dc2;
            EVar12 = RAInstBuilder::add(local_178,workReg,RVar38,uVar13,uVar36,uVar35,
                                        (RegMask)uVar16,uVar34,uVar37,
                                        (uint)rwInfo._operands[0]._reserved[lVar19 * 2 + -2],
                                        (uint32_t)local_148);
            if (EVar12 != 0) {
              return EVar12;
            }
            uVar16 = local_190 & 0xffffffff;
            puVar22 = (undefined1 *)CONCAT71((int7)(uVar16 >> 8),uVar41 == uVar16);
            if ((RVar38 & (kLeadConsecutive|kOutConsecutive|kUseConsecutive)) != kNone) {
              local_148 = (ulong)*(uint *)workReg;
            }
            local_190 = (ulong)((int)local_190 + (uint)(uVar41 == uVar16));
            EVar30 = local_170;
            inst = local_1a0;
            this = (RACFGBuilder *)local_1a8;
            goto LAB_00146e0a;
          }
          uVar35 = 0;
          if ((uVar31 & 8) == 0) {
LAB_00146d8d:
            uVar36 = 0xff;
            uVar34 = 0xff;
            goto LAB_00146d98;
          }
          if (local_184 == -1) {
            return 3;
          }
          if (local_184 == *(int *)workReg) {
            return 0x41;
          }
          uVar31 = local_194 + 1;
          pBVar32 = (BaseRAPass *)(ulong)uVar31;
          if (uVar31 < 4) {
            RVar38 = uVar31 * 0x2000 | RVar38 | kOutConsecutive;
LAB_00146d8a:
            local_194 = local_194 + 1;
            goto LAB_00146d8d;
          }
          goto LAB_0014737f;
        }
      }
LAB_00146e0a:
      uVar27 = uVar27 | 1 << EVar28._0_4_;
      uVar41 = uVar41 + 1;
      lVar19 = lVar19 + 0x10;
    } while (EVar30 != (Environment)lVar19);
    bVar11 = (byte)((uVar27 & 2) >> 1);
    pOVar24 = local_138;
    uVar16 = local_140;
    uVar41 = local_168;
    ib = local_178;
  }
  EVar28 = local_158;
  uVar27 = *(uint *)(inst + 0x38);
  uVar23 = (ulong)uVar27;
  if (uVar27 == 0) {
LAB_00146f9f:
    iVar40 = (int)uVar16;
    pBVar32 = local_160;
    if (((rwInfo._instFlags & kMovOp) != kNone) &&
       (bVar11 = *(int *)(inst + 0x38) == 0 & bVar11, bVar11 == 1)) {
      if (iVar40 == 3) {
        auVar44._0_4_ = -(uint)(*(int *)(inst + 0x50) == *(int *)(inst + 0x40));
        auVar44._4_4_ = -(uint)(*(int *)(inst + 0x54) == *(int *)(inst + 0x44));
        auVar44._8_4_ = -(uint)(*(int *)(inst + 0x58) == *(int *)(inst + 0x48));
        auVar44._12_4_ = -(uint)(*(int *)(inst + 0x5c) == *(int *)(inst + 0x4c));
        iVar14 = movmskps((int)CONCAT71((int7)(uVar23 >> 8),bVar11),auVar44);
        if (iVar14 == 0xf) goto LAB_00147016;
        goto LAB_00147067;
      }
      if (iVar40 != 2) goto LAB_00147067;
LAB_00147016:
      uVar27 = *(int *)(inst + 0x44) - 0x100;
      if (0xfffffefe < uVar27) goto LAB_00147067;
      pBVar33 = (((BaseRAPass *)this)->super_FuncPass).super_Pass._cb;
      if (uVar27 < *(uint *)&pBVar33[1].super_BaseEmitter._logger) {
        uVar16 = ~rwInfo._operands[0]._writeByteMask &
                 *(ulong *)(*(long *)((long)(&(pBVar33[1].super_BaseEmitter._code)->_environment)
                                            [uVar27] + 0x28) + 0x40);
        if ((uVar16 == 0) || ((rwInfo._operands[0]._extendByteMask & uVar16) == 0)) {
          ib[4] = (RAInstBuilder)((byte)ib[4] | 1);
        }
        goto LAB_00147067;
      }
      goto LAB_00147393;
    }
LAB_00147067:
    if ((uVar41 & 1) == 0) {
      pRVar18 = *(RAInstBuilder **)(ib + 0x38);
    }
    else {
      pRVar4 = *(RAInstBuilder **)(ib + 0x38);
      pRVar17 = ib + 0x40;
      pRVar18 = pRVar17;
      for (; pRVar17 != pRVar4; pRVar17 = pRVar17 + 0x20) {
        uVar25 = 0xff;
        if ((*(uint *)(pRVar17 + 8) >> 0x18 & 1) != 0) {
          uVar25 = 0xf;
        }
        *(ulong *)(pRVar17 + 0x10) = CONCAT44(uVar25,uVar25) & *(ulong *)(pRVar17 + 0x10);
        pRVar18 = pRVar4;
      }
    }
    if (((long)pRVar18 - (long)(ib + 0x40) & 0x1fffffffe0U) != 0x20) goto LAB_00147206;
    if ((uint)local_190 == iVar40) {
      bVar11 = (byte)((uint)*(undefined4 *)
                             (InstDB::_commonInfoTable +
                             (ulong)(*(uint *)(InstDB::_instInfoTable + (long)EVar28 * 8) >> 0xb &
                                    0x1ff8) + 4) >> 0x1e);
LAB_001470f9:
      if (bVar11 == 1) {
LAB_001471d8:
        lVar19 = 0x58;
        puVar22 = (undefined1 *)0x5c;
        uVar27 = 0xfffffff1;
        uVar13 = 4;
      }
      else {
        if (bVar11 != 2) goto LAB_00147206;
        lVar19 = 0x5c;
        puVar22 = (undefined1 *)0x58;
        uVar27 = 0xfffffff2;
        uVar13 = 8;
      }
LAB_001471ec:
      *(uint *)(ib + 0x48) = uVar27 & *(uint *)(ib + 0x48) | uVar13;
      *(uint *)(ib + lVar19) = *(uint *)(ib + lVar19) | *(uint *)(ib + (long)puVar22);
      *(undefined4 *)(ib + (long)puVar22) = 0;
LAB_00147206:
      *(uint *)&(local_160->super_FuncPass).super_Pass._vptr_Pass =
           *(uint *)(InstDB::_commonInfoTable +
                    (ulong)(*(uint *)(InstDB::_instInfoTable + (long)EVar28 * 8) >> 0xb & 0x1ff8) +
                    4) >> 0x1b & 7;
      return 0;
    }
    if (iVar40 == 4) {
      if ((byte)inst[0x13] < 4) goto LAB_0014738e;
      if (((*(uint *)(inst + 0x70) & 7) != 4) || ((*(uint *)local_150 & 0xfffffffe) != 0x61c))
      goto LAB_00147206;
      lVar19 = 0x5c;
      puVar22 = (undefined1 *)0x58;
      uVar13 = 8;
      uVar27 = 0xfffffff2;
      if ((inst[0x78] != (InstNode)0x0) &&
         (uVar27 = 0xfffffff2, uVar13 = 8, inst[0x78] != (InstNode)0xff)) goto LAB_00147206;
      goto LAB_001471ec;
    }
    if (iVar40 != 2) goto LAB_00147206;
    if ((byte)inst[0x13] < 2) goto LAB_00147389;
    if ((*(uint *)(inst + 0x50) & 7) != 4) goto LAB_00147206;
    pp_Var5 = (((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass;
    uVar27 = *(uint *)(ib + 0x40);
    if (uVar27 < *(uint *)(pp_Var5 + 0x29)) {
      uVar27 = *(uint *)(*(long *)(pp_Var5[0x28] + (ulong)uVar27 * 8) + 0x20);
      iVar40 = *(int *)local_150;
      bVar10 = 0;
      bVar11 = bVar10;
      if (iVar40 < 0x2b7) {
        if ((iVar40 != 9) && (iVar40 != 0x17)) {
          if (iVar40 != 0x1eb) goto LAB_00147206;
          uVar13 = (pOVar24->_signature)._bits;
          uVar31 = uVar13 >> 0x18;
          if ((uVar13 < 0x4000000) && (uVar31 < uVar27 >> 0x18)) {
LAB_00147355:
            bVar11 = 0;
          }
          else {
            if (*(long *)(inst + 0x58) != -1) {
              EVar30._0_4_ = uVar31 - 1;
              EVar30._platformABI = kUnknown;
              EVar30._objectFormat = kUnknown;
              EVar30._floatABI = kHardFloat;
              EVar30._reserved = '\0';
              if (0xfe < EVar30._0_4_) goto LAB_0014739d;
              uVar13 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              if (*(long *)(inst + 0x58) !=
                  *(long *)(raImmMaskFromSize(unsigned_int)::masks + (ulong)uVar13 * 8))
              goto LAB_00147355;
            }
            bVar11 = 2;
          }
        }
      }
      else if (iVar40 < 0x2f9) {
        if ((0x3f < iVar40 - 0x2b7U) ||
           (bVar11 = 0, (0x8000000000002003U >> ((ulong)(iVar40 - 0x2b7U) & 0x3f) & 1) == 0))
        goto LAB_00147206;
      }
      else {
        bVar11 = 0;
        if (((iVar40 != 0x2f9) && (bVar11 = bVar10, iVar40 != 0x311)) && (iVar40 != 0x6a8))
        goto LAB_00147206;
      }
      if (((*(char *)((long)&(pOVar24->_signature)._bits + 3) == '\x04') && (0x4ffffff < uVar27)) ||
         (*(long *)(inst + 0x58) != 0)) goto LAB_001470f9;
      goto LAB_001471d8;
    }
  }
  else {
    uVar13 = *(int *)(inst + 0x3c) - 0x100;
    if (0xfffffefe < uVar13) {
      uVar23 = (ulong)(uVar27 & 0xf00);
      if ((uVar27 & 0xf00) == 0x200) {
        uVar27 = 0;
        if (*(int *)(inst + 0x3c) == 0) {
          uVar27 = (uint)local_190;
        }
        uVar23 = (ulong)uVar27;
        local_190 = uVar23;
      }
      goto LAB_00146f9f;
    }
    pBVar32 = (BaseRAPass *)(((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass;
    pBVar33 = (pBVar32->super_FuncPass).super_Pass._cb;
    if (*(uint *)&pBVar33[1].super_BaseEmitter._logger <= uVar13) {
      return 0x1e;
    }
    EVar30 = (&(pBVar33[1].super_BaseEmitter._code)->_environment)[uVar13];
    workReg = *(RAWorkReg **)((long)EVar30 + 0x28);
    if ((workReg == (RAWorkReg *)0x0) &&
       (EVar12 = BaseRAPass::_asWorkReg(pBVar32,(VirtReg *)EVar30,&workReg),
       this = (RACFGBuilder *)local_1a8, EVar12 != 0)) {
      return EVar12;
    }
    bVar10 = (byte)workReg[0x21] & 0xf;
    EVar30 = (Environment)workReg;
    if (bVar10 < 4) {
      useRegMask = *(RegMask *)
                    ((long)(((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass +
                    ((ulong)(byte)workReg[0x21] & 0xf) * 4 + 0x118);
      if (bVar10 == 2) {
        RVar38 = kUse|kRead;
        uVar35 = 0xff;
        local_190 = 0;
      }
      else {
        RVar38 = kUse|kRW;
        uVar35 = 1;
      }
      puStackY_1f0 = (undefined1 *)0x146f84;
      EVar12 = RAInstBuilder::add(ib,workReg,RVar38,useRegMask,uVar35,1,useRegMask,0xff,0,0,
                                  0xffffffff);
      uVar23 = (ulong)EVar12;
      inst = local_1a0;
      this = (RACFGBuilder *)local_1a8;
      if (EVar12 != 0) {
        return EVar12;
      }
      goto LAB_00146f9f;
    }
LAB_00147384:
    onInst();
LAB_00147389:
    onInst();
LAB_0014738e:
    onInst();
LAB_00147393:
    onInst();
  }
  onInst();
LAB_0014739d:
  onInst();
  puStackY_1f0 = (undefined1 *)(ulong)*(byte *)((long)EVar30 + 0xf4);
  pBVar33 = (pBVar32->super_FuncPass).super_Pass._cb;
  uVar35 = (pBVar33->super_BaseEmitter)._gpSignature._bits;
  pBVar33->_cursor = *(BaseNode **)EVar30;
  if (puStackY_1f0 != (undefined1 *)0x0) {
    bVar11 = (byte)uVar35 >> 3;
    lVar19 = (long)EVar30 + 0x11c;
    lVar26 = 0;
    invokeNode = (InvokeNode *)0x0;
    do {
      if (invokeNode == (InvokeNode *)0x20) {
LAB_001479b8:
        onBeforeInvoke();
        goto LAB_001479bd;
      }
      lVar42 = 0;
      lVar39 = lVar26;
      pIStackY_218 = invokeNode;
      do {
        uVar27 = *(uint *)(lVar19 + lVar42);
        if (uVar27 == 0) break;
        if (*(byte *)((long)EVar30 + 0xf4) <= (byte)invokeNode) {
          onBeforeInvoke();
          return 0x1e;
        }
        lVar6 = *(long *)((long)EVar30 + 0x360);
        uVar13 = *(uint *)(lVar6 + lVar42 * 4 + lVar26);
        if (uVar13 != 0) {
          arg = (FuncValue *)(lVar19 + lVar42);
          pOVar24 = (Operand_ *)(lVar6 + lVar39);
          uVar13 = uVar13 & 7;
          if (uVar13 == 4) {
            if ((uVar27 >> 8 & 1) == 0) {
              EVar12 = moveImmToStackArg((RACFGBuilder *)pBVar32,invokeNode,arg,(Imm *)pOVar24);
joined_r0x00147503:
              invokeNode = pIStackY_218;
              if (EVar12 != 0) {
                return EVar12;
              }
            }
            else {
              OStackY_230._signature._bits = 1;
              OStackY_230._baseId = 0xff;
              OStackY_230._data[0] = 0;
              OStackY_230._data[1] = 0;
              EVar12 = moveImmToRegArg((RACFGBuilder *)pBVar32,invokeNode,arg,(Imm *)pOVar24,
                                       (BaseReg *)&OStackY_230);
              if (EVar12 != 0) {
                return EVar12;
              }
              puVar2 = (undefined8 *)(*(long *)((long)EVar30 + 0x360) + lVar42 * 4 + lVar26);
              *puVar2 = CONCAT44(OStackY_230._baseId,OStackY_230._signature._bits);
              puVar2[1] = CONCAT44(OStackY_230._data[1],OStackY_230._data[0]);
              invokeNode = pIStackY_218;
            }
          }
          else if (uVar13 == 1) {
            pBVar7 = (BaseRAPass *)(pBVar32->super_FuncPass).super_Pass._vptr_Pass;
            uVar13 = *(int *)(lVar6 + 4 + lVar42 * 4 + lVar26) - 0x100;
            pBVar33 = (pBVar7->super_FuncPass).super_Pass._cb;
            if (*(uint *)&pBVar33[1].super_BaseEmitter._logger <= uVar13) {
              return 0x1e;
            }
            EVar28 = (&(pBVar33[1].super_BaseEmitter._code)->_environment)[uVar13];
            lVar8 = *(long *)((long)EVar28 + 0x28);
            OStackY_210._signature._bits = (int)lVar8;
            OStackY_210._baseId = (int)((ulong)lVar8 >> 0x20);
            if (lVar8 == 0) {
              EVar12 = BaseRAPass::_asWorkReg(pBVar7,(VirtReg *)EVar28,(RAWorkReg **)&OStackY_210);
              if (EVar12 != 0) {
                return EVar12;
              }
              uVar27 = arg->_data;
            }
            if ((uVar27 >> 8 & 1) == 0) {
              if ((uVar27 >> 10 & 1) != 0) {
                uVar27 = *(uint *)(lVar6 + lVar42 * 4 + lVar26);
                if ((uVar27 & 0xf00) == 0) {
                  if (bVar11 != (byte)(uVar27 >> 3)) {
                    return 0x19;
                  }
                  EVar12 = moveRegToStackArg((RACFGBuilder *)pBVar32,(InvokeNode *)EVar28,arg,
                                             (BaseReg *)pOVar24);
                  invokeNode = pIStackY_218;
                  if (EVar12 != 0) {
                    return EVar12;
                  }
                  goto LAB_00147696;
                }
                OStackY_230._signature._bits = 1;
                OStackY_230._baseId = 0xff;
                OStackY_230._data[0] = 0;
                OStackY_230._data[1] = 0;
                EVar28 = EVar30;
                moveVecToPtr((RACFGBuilder *)pBVar32,(InvokeNode *)EVar30,arg,(Vec *)pOVar24,
                             (BaseReg *)&OStackY_230);
                pOVar24 = &OStackY_230;
              }
              EVar12 = moveRegToStackArg((RACFGBuilder *)pBVar32,(InvokeNode *)EVar28,arg,
                                         (BaseReg *)pOVar24);
              goto joined_r0x00147503;
            }
            if (0x1fffffff < uVar27) {
              onBeforeInvoke();
              goto LAB_001479b8;
            }
            if ((uVar27 >> 10 & 1) == 0) {
              bVar43 = ((*(uint *)(OStackY_210._0_8_ + 0x20) ^
                        *(uint *)(_archTraits + (ulong)(uVar27 >> 0x18) * 4 + 0xec)) & 0xf00) == 0;
            }
            else {
              uVar27 = *(uint *)(lVar6 + lVar42 * 4 + lVar26);
              if ((uVar27 & 0xf00) != 0) {
                OStackY_230._signature._bits = 1;
                OStackY_230._baseId = 0xff;
                OStackY_230._data[0] = 0;
                OStackY_230._data[1] = 0;
                moveVecToPtr((RACFGBuilder *)pBVar32,(InvokeNode *)EVar30,arg,(Vec *)pOVar24,
                             (BaseReg *)&OStackY_230);
                puVar2 = (undefined8 *)(*(long *)((long)EVar30 + 0x360) + lVar42 * 4 + lVar26);
                *puVar2 = CONCAT44(OStackY_230._baseId,OStackY_230._signature._bits);
                puVar2[1] = CONCAT44(OStackY_230._data[1],OStackY_230._data[0]);
                invokeNode = pIStackY_218;
                goto LAB_00147696;
              }
              bVar43 = bVar11 == (byte)(uVar27 >> 3);
            }
            invokeNode = pIStackY_218;
            if (!bVar43) {
              return 0x19;
            }
          }
        }
LAB_00147696:
        lVar42 = lVar42 + 4;
        lVar39 = lVar39 + 0x10;
      } while (lVar42 != 0x10);
      invokeNode = (InvokeNode *)&invokeNode->field_0x1;
      lVar19 = lVar19 + 0x10;
      lVar26 = lVar26 + 0x40;
    } while (invokeNode != (InvokeNode *)puStackY_1f0);
    pBVar33 = (pBVar32->super_FuncPass).super_Pass._cb;
  }
  pBVar33->_cursor = (BaseNode *)EVar30;
  if (((*(byte *)((long)EVar30 + 0x88) & 1) != 0) && (*(int *)((long)EVar30 + 0x108) != 0)) {
    OStackY_230._signature._bits = (pBVar33->super_BaseEmitter)._gpSignature._bits;
    OStackY_230._baseId = 4;
    OStackY_230._data[0] = 0;
    OStackY_230._data[1] = 0;
    OStackY_210._data[0] = *(int *)((long)EVar30 + 0x108);
    OStackY_210._signature._bits = 4;
    OStackY_210._baseId = 0;
    OStackY_210._data[1] = 0;
    EVar12 = BaseEmitter::_emitI(&pBVar33->super_BaseEmitter,0x311,&OStackY_230,&OStackY_210);
    if (EVar12 != 0) {
      return EVar12;
    }
  }
  if (*(int *)((long)EVar30 + 0x10c) != 0) {
    lVar19 = 199;
    do {
      uVar27 = *(uint *)((long)EVar30 + 0x45 + lVar19);
      if (uVar27 == 0) break;
      if ((*(uint *)((long)EVar30 + lVar19 * 4) & 7) == 1) {
        pBVar7 = (BaseRAPass *)(pBVar32->super_FuncPass).super_Pass._vptr_Pass;
        uVar13 = *(int *)((long)EVar30 + 4 + lVar19 * 4) - 0x100;
        pBVar33 = (pBVar7->super_FuncPass).super_Pass._cb;
        if (*(uint *)&pBVar33[1].super_BaseEmitter._logger <= uVar13) {
          return 0x1e;
        }
        EVar28 = (&(pBVar33[1].super_BaseEmitter._code)->_environment)[uVar13];
        pRStackY_1f8 = *(RAWorkReg **)((long)EVar28 + 0x28);
        if (pRStackY_1f8 == (RAWorkReg *)0x0) {
          EVar12 = BaseRAPass::_asWorkReg(pBVar7,(VirtReg *)EVar28,&pRStackY_1f8);
          if (EVar12 != 0) {
            return EVar12;
          }
          uVar27 = *(uint *)((long)EVar30 + 0x45 + lVar19);
        }
        if ((uVar27 >> 8 & 1) != 0) {
          if (uVar27 >> 0x18 == 0x16) {
            OStackY_230._signature._bits = *(uint32_t *)(pRStackY_1f8 + 0x20);
            if ((OStackY_230._signature._bits & 0xf00) != 0x100) {
              return 0x19;
            }
            OStackY_230._baseId = *(uint32_t *)(pRStackY_1f8 + 4);
            OStackY_230._data[0] = 0;
            OStackY_230._data[1] = 0;
            OStackY_210._0_12_ = ZEXT812(2);
            OStackY_210._data[1] = 0;
            cVar20 = TypeUtils::_typeData[*(byte *)(*(long *)(pRStackY_1f8 + 8) + 0xd)];
            if ((char)uVar27 != '\0') {
              cVar20 = (char)uVar27;
            }
            if (cVar20 == '+') {
              EVar12 = BaseRAPass::useTemporaryMem
                                 ((BaseRAPass *)(pBVar32->super_FuncPass).super_Pass._vptr_Pass,
                                  (BaseMem *)&OStackY_210,8,4);
              if (EVar12 != 0) {
                return EVar12;
              }
              OStackY_210._signature._bits._3_1_ = 8;
              EVar12 = BaseEmitter::_emitI(&((pBVar32->super_FuncPass).super_Pass._cb)->
                                            super_BaseEmitter,0x103,&OStackY_210);
              if (EVar12 != 0) {
                return EVar12;
              }
              IVar29 = 0x1d6;
              if (pBVar32->field_0x292 != '\0') {
                IVar29 = 0x4c1;
              }
              EVar12 = BaseEmitter::_emitI(&((pBVar32->super_FuncPass).super_Pass._cb)->
                                            super_BaseEmitter,IVar29,&OStackY_230,&OStackY_210);
            }
            else {
              if (cVar20 != '*') {
                return 0x19;
              }
              EVar12 = BaseRAPass::useTemporaryMem
                                 ((BaseRAPass *)(pBVar32->super_FuncPass).super_Pass._vptr_Pass,
                                  (BaseMem *)&OStackY_210,4,4);
              if (EVar12 != 0) {
                return EVar12;
              }
              OStackY_210._signature._bits._3_1_ = 4;
              EVar12 = BaseEmitter::_emitI(&((pBVar32->super_FuncPass).super_Pass._cb)->
                                            super_BaseEmitter,0x103,&OStackY_210);
              if (EVar12 != 0) {
                return EVar12;
              }
              IVar29 = 0x1d9;
              if (pBVar32->field_0x292 != '\0') {
                IVar29 = 0x4c5;
              }
              EVar12 = BaseEmitter::_emitI(&((pBVar32->super_FuncPass).super_Pass._cb)->
                                            super_BaseEmitter,IVar29,&OStackY_230,&OStackY_210);
            }
            if (EVar12 != 0) {
              return EVar12;
            }
          }
          else {
            if (0x1fffffff < uVar27) {
LAB_001479bd:
              onBeforeInvoke();
              __clang_call_terminate(extraout_RAX_00);
            }
            if (((*(uint *)(_archTraits + (ulong)(uVar27 >> 0x18) * 4 + 0xec) ^
                 *(uint *)(pRStackY_1f8 + 0x20)) & 0xf00) != 0) {
              return 0x19;
            }
          }
        }
      }
      lVar19 = lVar19 + 4;
    } while (lVar19 != 0xd7);
  }
  puVar1 = (uint *)((pBVar32->super_FuncPass).super_Pass._name + 0xc);
  *puVar1 = *puVar1 | 0x1000;
  p_Var9 = (pBVar32->super_FuncPass).super_Pass._vptr_Pass[0x13];
  *(uint *)(p_Var9 + 0x2d0) = *(uint *)(p_Var9 + 0x2d0) | 0x20;
  uVar27 = *(uint *)((long)EVar30 + 0x108);
  if (*(uint *)((long)EVar30 + 0x108) < *(uint *)(p_Var9 + 0x2e0)) {
    uVar27 = *(uint *)(p_Var9 + 0x2e0);
  }
  *(uint *)(p_Var9 + 0x2e0) = uVar27;
  return 0;
}

Assistant:

Error RACFGBuilder::onInst(InstNode* inst, InstControlFlow& cf, RAInstBuilder& ib) noexcept {
  InstRWInfo rwInfo;

  InstId instId = inst->id();
  if (Inst::isDefinedId(instId)) {
    uint32_t opCount = inst->opCount();
    const Operand* opArray = inst->operands();
    ASMJIT_PROPAGATE(InstInternal::queryRWInfo(_arch, inst->baseInst(), opArray, opCount, &rwInfo));

    const InstDB::InstInfo& instInfo = InstDB::infoById(instId);
    bool hasGpbHiConstraint = false;
    uint32_t singleRegOps = 0;

    // Copy instruction RW flags to instruction builder except kMovOp, which is propagated manually later.
    ib.addInstRWFlags(rwInfo.instFlags() & ~InstRWFlags::kMovOp);

    // Mask of all operand types used by the instruction - can be used as an optimization later.
    uint32_t opTypesMask = 0u;

    if (opCount) {
      // The mask is for all registers, but we are mostly interested in AVX-512 registers at the moment. The mask
      // will be combined with all available registers of the Compiler at the end so we it never use more registers
      // than available.
      RegMask instructionAllowedRegs = 0xFFFFFFFFu;

      uint32_t consecutiveOffset = 0;
      uint32_t consecutiveLeadId = Globals::kInvalidId;
      uint32_t consecutiveParent = Globals::kInvalidId;

      if (instInfo.isEvex()) {
        // EVEX instruction and VEX instructions that can be encoded with EVEX have the possibility to use 32 SIMD
        // registers (XMM/YMM/ZMM).
        if (instInfo.isVex() && !instInfo.isEvexCompatible()) {
          if (instInfo.isEvexKRegOnly()) {
            // EVEX encodable only if the first operand is K register (compare instructions).
            if (!Reg::isKReg(opArray[0]))
              instructionAllowedRegs = 0xFFFFu;
          }
          else if (instInfo.isEvexTwoOpOnly()) {
            // EVEX encodable only if the instruction has two operands (gather instructions).
            if (opCount != 2)
              instructionAllowedRegs = 0xFFFFu;
          }
          else {
            instructionAllowedRegs = 0xFFFFu;
          }
        }
      }
      else if (instInfo.isEvexTransformable()) {
        ib.addAggregatedFlags(RATiedFlags::kInst_IsTransformable);
      }
      else {
        // Not EVEX, restrict everything to [0-15] registers.
        instructionAllowedRegs = 0xFFFFu;
      }

      for (uint32_t i = 0; i < opCount; i++) {
        const Operand& op = opArray[i];
        const OpRWInfo& opRwInfo = rwInfo.operand(i);

        opTypesMask |= 1u << uint32_t(op.opType());

        if (op.isReg()) {
          // Register Operand
          // ----------------
          const Reg& reg = op.as<Reg>();

          RATiedFlags flags = raRegRwFlags(opRwInfo.opFlags());
          RegMask allowedRegs = instructionAllowedRegs;

          if (opRwInfo.isUnique())
            flags |= RATiedFlags::kUnique;

          // X86-specific constraints related to LO|HI general purpose registers. This is only required when the
          // register is part of the encoding. If the register is fixed we won't restrict anything as it doesn't
          // restrict encoding of other registers.
          if (reg.isGpb() && !opRwInfo.hasOpFlag(OpRWFlags::kRegPhysId)) {
            flags |= RATiedFlags::kX86_Gpb;
            if (!_is64Bit) {
              // Restrict to first four - AL|AH|BL|BH|CL|CH|DL|DH. In 32-bit mode it's not possible to access
              // SIL|DIL, etc, so this is just enough.
              allowedRegs = 0x0Fu;
            }
            else {
              // If we encountered GPB-HI register the situation is much more complicated than in 32-bit mode.
              // We need to patch all registers to not use ID higher than 7 and all GPB-LO registers to not use
              // index higher than 3. Instead of doing the patching here we just set a flag and will do it later,
              // to not complicate this loop.
              if (reg.isGpbHi()) {
                hasGpbHiConstraint = true;
                allowedRegs = 0x0Fu;
              }
            }
          }

          uint32_t vIndex = Operand::virtIdToIndex(reg.id());
          if (vIndex < Operand::kVirtIdCount) {
            RAWorkReg* workReg;
            ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

            // Use RW instead of Write in case that not the whole register is overwritten. This is important
            // for liveness as we cannot kill a register that will be used. For example `mov al, 0xFF` is not
            // a write-only operation if user allocated the whole `rax` register.
            if ((flags & RATiedFlags::kRW) == RATiedFlags::kWrite) {
              if (workReg->regByteMask() & ~(opRwInfo.writeByteMask() | opRwInfo.extendByteMask())) {
                // Not write-only operation.
                flags = (flags & ~RATiedFlags::kOut) | (RATiedFlags::kRead | RATiedFlags::kUse);
              }
            }

            // Do not use RegMem flag if changing Reg to Mem requires a CPU feature that is not available.
            if (rwInfo.rmFeature() && Support::test(flags, RATiedFlags::kUseRM | RATiedFlags::kOutRM)) {
              if (!cc()->code()->cpuFeatures().has(rwInfo.rmFeature())) {
                flags &= ~(RATiedFlags::kUseRM | RATiedFlags::kOutRM);
              }
            }

            RegGroup group = workReg->group();
            RegMask useRegs = _pass->_availableRegs[group] & allowedRegs;
            RegMask outRegs = useRegs;

            uint32_t useId = BaseReg::kIdBad;
            uint32_t outId = BaseReg::kIdBad;

            uint32_t useRewriteMask = 0;
            uint32_t outRewriteMask = 0;

            if (opRwInfo.consecutiveLeadCount()) {
              // There must be a single consecutive register lead, otherwise the RW data is invalid.
              if (consecutiveLeadId != Globals::kInvalidId)
                return DebugUtils::errored(kErrorInvalidState);

              // A consecutive lead register cannot be used as a consecutive +1/+2/+3 register, the registers must be distinct.
              if (RATiedReg::consecutiveDataFromFlags(flags) != 0)
                return DebugUtils::errored(kErrorNotConsecutiveRegs);

              flags |= RATiedFlags::kLeadConsecutive | RATiedReg::consecutiveDataToFlags(opRwInfo.consecutiveLeadCount() - 1);
              consecutiveLeadId = workReg->workId();

              RegMask filter = raConsecutiveLeadCountToRegMaskFilter[opRwInfo.consecutiveLeadCount()];
              if (Support::test(flags, RATiedFlags::kUse)) {
                flags |= RATiedFlags::kUseConsecutive;
                useRegs &= filter;
              }
              else {
                flags |= RATiedFlags::kOutConsecutive;
                outRegs &= filter;
              }
            }

            if (Support::test(flags, RATiedFlags::kUse)) {
              useRewriteMask = Support::bitMask(inst->getRewriteIndex(&reg._baseId));
              if (opRwInfo.hasOpFlag(OpRWFlags::kRegPhysId)) {
                useId = opRwInfo.physId();
                flags |= RATiedFlags::kUseFixed;
              }
              else if (opRwInfo.hasOpFlag(OpRWFlags::kConsecutive)) {
                if (consecutiveLeadId == Globals::kInvalidId)
                  return DebugUtils::errored(kErrorInvalidState);

                if (consecutiveLeadId == workReg->workId())
                  return DebugUtils::errored(kErrorOverlappedRegs);

                flags |= RATiedFlags::kUseConsecutive | RATiedReg::consecutiveDataToFlags(++consecutiveOffset);
              }
            }
            else {
              outRewriteMask = Support::bitMask(inst->getRewriteIndex(&reg._baseId));
              if (opRwInfo.hasOpFlag(OpRWFlags::kRegPhysId)) {
                outId = opRwInfo.physId();
                flags |= RATiedFlags::kOutFixed;
              }
              else if (opRwInfo.hasOpFlag(OpRWFlags::kConsecutive)) {
                if (consecutiveLeadId == Globals::kInvalidId)
                  return DebugUtils::errored(kErrorInvalidState);

                if (consecutiveLeadId == workReg->workId())
                  return DebugUtils::errored(kErrorOverlappedRegs);

                flags |= RATiedFlags::kOutConsecutive | RATiedReg::consecutiveDataToFlags(++consecutiveOffset);
              }
            }

            ASMJIT_PROPAGATE(ib.add(workReg, flags, useRegs, useId, useRewriteMask, outRegs, outId, outRewriteMask, opRwInfo.rmSize(), consecutiveParent));
            if (singleRegOps == i)
              singleRegOps++;

            if (Support::test(flags, RATiedFlags::kLeadConsecutive | RATiedFlags::kUseConsecutive | RATiedFlags::kOutConsecutive))
              consecutiveParent = workReg->workId();
          }
        }
        else if (op.isMem()) {
          // Memory Operand
          // --------------
          const Mem& mem = op.as<Mem>();
          ib.addForbiddenFlags(RATiedFlags::kUseRM | RATiedFlags::kOutRM);

          if (mem.isRegHome()) {
            RAWorkReg* workReg;
            ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(mem.baseId()), &workReg));
            _pass->getOrCreateStackSlot(workReg);
          }
          else if (mem.hasBaseReg()) {
            uint32_t vIndex = Operand::virtIdToIndex(mem.baseId());
            if (vIndex < Operand::kVirtIdCount) {
              RAWorkReg* workReg;
              ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

              RATiedFlags flags = raMemBaseRwFlags(opRwInfo.opFlags());
              RegGroup group = workReg->group();
              RegMask inOutRegs = _pass->_availableRegs[group];

              uint32_t useId = BaseReg::kIdBad;
              uint32_t outId = BaseReg::kIdBad;

              uint32_t useRewriteMask = 0;
              uint32_t outRewriteMask = 0;

              if (Support::test(flags, RATiedFlags::kUse)) {
                useRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._baseId));
                if (opRwInfo.hasOpFlag(OpRWFlags::kMemPhysId)) {
                  useId = opRwInfo.physId();
                  flags |= RATiedFlags::kUseFixed;
                }
              }
              else {
                outRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._baseId));
                if (opRwInfo.hasOpFlag(OpRWFlags::kMemPhysId)) {
                  outId = opRwInfo.physId();
                  flags |= RATiedFlags::kOutFixed;
                }
              }

              ASMJIT_PROPAGATE(ib.add(workReg, flags, inOutRegs, useId, useRewriteMask, inOutRegs, outId, outRewriteMask));
            }
          }

          if (mem.hasIndexReg()) {
            uint32_t vIndex = Operand::virtIdToIndex(mem.indexId());
            if (vIndex < Operand::kVirtIdCount) {
              RAWorkReg* workReg;
              ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

              RATiedFlags flags = raMemIndexRwFlags(opRwInfo.opFlags());
              RegGroup group = workReg->group();
              RegMask inOutRegs = _pass->_availableRegs[group] & instructionAllowedRegs;

              // Index registers have never fixed id on X86/x64.
              const uint32_t useId = BaseReg::kIdBad;
              const uint32_t outId = BaseReg::kIdBad;

              uint32_t useRewriteMask = 0;
              uint32_t outRewriteMask = 0;

              if (Support::test(flags, RATiedFlags::kUse))
                useRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._data[Operand::kDataMemIndexId]));
              else
                outRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._data[Operand::kDataMemIndexId]));

              ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRead, inOutRegs, useId, useRewriteMask, inOutRegs, outId, outRewriteMask));
            }
          }
        }
      }
    }

    // Handle extra operand (either REP {cx|ecx|rcx} or AVX-512 {k} selector).
    if (inst->hasExtraReg()) {
      uint32_t vIndex = Operand::virtIdToIndex(inst->extraReg().id());
      if (vIndex < Operand::kVirtIdCount) {
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

        RegGroup group = workReg->group();
        RegMask inOutRegs = _pass->_availableRegs[group];
        uint32_t rewriteMask = Support::bitMask(inst->getRewriteIndex(&inst->extraReg()._id));

        if (group == RegGroup::kX86_K) {
          // AVX-512 mask selector {k} register - read-only, allocable to any register except {k0}.
          ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRead, inOutRegs, BaseReg::kIdBad, rewriteMask, inOutRegs, BaseReg::kIdBad, 0));
          singleRegOps = 0;
        }
        else {
          // REP {cx|ecx|rcx} register - read & write, allocable to {cx|ecx|rcx} only.
          ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRW, inOutRegs, Gp::kIdCx, rewriteMask, inOutRegs, Gp::kIdBad, 0));
        }
      }
      else {
        RegGroup group = inst->extraReg().group();
        if (group == RegGroup::kX86_K && inst->extraReg().id() != 0)
          singleRegOps = 0;
      }
    }

    // If this instruction has move semantics then check whether it could be eliminated if all virtual registers
    // are allocated into the same register. Take into account the virtual size of the destination register as that's
    // more important than a physical register size in this case.
    if (rwInfo.hasInstFlag(InstRWFlags::kMovOp) && !inst->hasExtraReg() && Support::bitTest(opTypesMask, uint32_t(OperandType::kReg))) {
      // AVX+ move instructions have 3 operand form - the first two operands must be the same to guarantee move semantics.
      if (opCount == 2 || (opCount == 3 && opArray[0] == opArray[1])) {
        uint32_t vIndex = Operand::virtIdToIndex(opArray[0].as<Reg>().id());
        if (vIndex < Operand::kVirtIdCount) {
          const VirtReg* vReg = _cc->virtRegByIndex(vIndex);
          const OpRWInfo& opRwInfo = rwInfo.operand(0);

          uint64_t remainingByteMask = vReg->workReg()->regByteMask() & ~opRwInfo.writeByteMask();
          if (remainingByteMask == 0u || (remainingByteMask & opRwInfo.extendByteMask()) == 0)
            ib.addInstRWFlags(InstRWFlags::kMovOp);
        }
      }
    }

    // Handle X86 constraints.
    if (hasGpbHiConstraint) {
      for (RATiedReg& tiedReg : ib) {
        RegMask filter = tiedReg.hasFlag(RATiedFlags::kX86_Gpb) ? 0x0Fu : 0xFFu;
        tiedReg._useRegMask &= filter;
        tiedReg._outRegMask &= filter;
      }
    }

    if (ib.tiedRegCount() == 1) {
      // Handle special cases of some instructions where all operands share the same
      // register. In such case the single operand becomes read-only or write-only.
      InstSameRegHint sameRegHint = InstSameRegHint::kNone;
      if (singleRegOps == opCount) {
        sameRegHint = instInfo.sameRegHint();
      }
      else if (opCount == 2 && inst->op(1).isImm()) {
        // Handle some tricks used by X86 asm.
        const BaseReg& reg = inst->op(0).as<BaseReg>();
        const Imm& imm = inst->op(1).as<Imm>();

        const RAWorkReg* workReg = _pass->workRegById(ib[0]->workId());
        uint32_t workRegSize = workReg->signature().size();

        switch (inst->id()) {
          case Inst::kIdOr: {
            // Sets the value of the destination register to -1, previous content unused.
            if (reg.size() >= 4 || reg.size() >= workRegSize) {
              if (imm.value() == -1 || imm.valueAs<uint64_t>() == raImmMaskFromSize(reg.size()))
                sameRegHint = InstSameRegHint::kWO;
            }
            ASMJIT_FALLTHROUGH;
          }

          case Inst::kIdAdd:
          case Inst::kIdAnd:
          case Inst::kIdRol:
          case Inst::kIdRor:
          case Inst::kIdSar:
          case Inst::kIdShl:
          case Inst::kIdShr:
          case Inst::kIdSub:
          case Inst::kIdXor: {
            // Updates [E|R]FLAGS without changing the content.
            if (reg.size() != 4 || reg.size() >= workRegSize) {
              if (imm.value() == 0)
                sameRegHint = InstSameRegHint::kRO;
            }
            break;
          }
        }
      }
      else if (opCount == 4 && inst->op(3).isImm()) {
        const Imm& imm = inst->op(3).as<Imm>();

        switch (inst->id()) {
          case Inst::kIdVpternlogd:
          case Inst::kIdVpternlogq: {
            uint32_t predicate = uint32_t(imm.value() & 0xFFu);
            if (predicate == 0x00u || predicate == 0xFFu) {
              ib[0]->makeWriteOnly();
            }
            break;
          }
        }
      }

      switch (sameRegHint) {
        case InstSameRegHint::kNone:
          break;
        case InstSameRegHint::kRO:
          ib[0]->makeReadOnly();
          break;
        case InstSameRegHint::kWO:
          ib[0]->makeWriteOnly();
          break;
      }
    }

    cf = instInfo.controlFlow();
  }

  return kErrorOk;
}